

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O0

void Sbm_AddCardinConstrTest(void)

{
  sat_solver *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *begin;
  int *piVar6;
  int local_3c;
  int status;
  int i;
  int Lit;
  int nVarsReal;
  sat_solver *pSat;
  Vec_Int_t *vLits;
  Vec_Int_t *vVars;
  int Count;
  int K;
  int nVars;
  int LogN;
  
  K = 3;
  Count = 8;
  vVars._4_4_ = 2;
  vVars._0_4_ = 1;
  pSat = (sat_solver *)Vec_IntAlloc(8);
  _Lit = Sbm_AddCardinSolver(K,&vLits);
  i = sat_solver_nvars(_Lit);
  iVar4 = Vec_IntEntry(vLits,vVars._4_4_);
  status = Abc_Var2Lit(iVar4,1);
  iVar3 = K;
  iVar2 = Count;
  iVar4 = i;
  uVar5 = sat_solver_nclauses(_Lit);
  printf("LogN = %d. N = %3d.   Vars = %5d. Clauses = %6d.  Comb = %d.\n",(ulong)(uint)iVar3,
         (ulong)(uint)iVar2,(ulong)(uint)iVar4,(ulong)uVar5,
         (ulong)((Count * (Count + -1)) / 2 + Count + 1));
  do {
    iVar4 = sat_solver_solve(_Lit,&status,&i,0,0,0,0);
    if (iVar4 != 1) break;
    Vec_IntClear((Vec_Int_t *)pSat);
    vVars._0_4_ = (int)vVars + 1;
    printf("%3d : ");
    for (local_3c = 0; psVar1 = pSat, local_3c < Count; local_3c = local_3c + 1) {
      iVar4 = sat_solver_var_value(_Lit,local_3c);
      iVar4 = Abc_Var2Lit(local_3c,iVar4);
      Vec_IntPush((Vec_Int_t *)psVar1,iVar4);
      uVar5 = sat_solver_var_value(_Lit,local_3c);
      printf("%d",(ulong)uVar5);
    }
    printf("\n");
    psVar1 = _Lit;
    begin = Vec_IntArray((Vec_Int_t *)pSat);
    piVar6 = Vec_IntArray((Vec_Int_t *)pSat);
    iVar4 = sat_solver_addclause(psVar1,begin,piVar6 + Count);
  } while (iVar4 != 0);
  sat_solver_delete(_Lit);
  Vec_IntFree(vLits);
  Vec_IntFree((Vec_Int_t *)pSat);
  return;
}

Assistant:

void Sbm_AddCardinConstrTest()
{
    int LogN = 3, nVars = 1 << LogN, K = 2, Count = 1;
    Vec_Int_t * vVars, * vLits = Vec_IntAlloc( nVars );
    sat_solver * pSat = Sbm_AddCardinSolver( LogN, &vVars );
    int nVarsReal = sat_solver_nvars( pSat );

    int Lit = Abc_Var2Lit( Vec_IntEntry(vVars, K), 1 );
    printf( "LogN = %d. N = %3d.   Vars = %5d. Clauses = %6d.  Comb = %d.\n", LogN, nVars, nVarsReal, sat_solver_nclauses(pSat), nVars * (nVars-1)/2 + nVars + 1 );
    while ( 1 )
    {
        int i, status = sat_solver_solve( pSat, &Lit, &Lit+1, 0, 0, 0, 0 );
        if ( status != l_True )
            break;
        Vec_IntClear( vLits );
        printf( "%3d : ", Count++ );
        for ( i = 0; i < nVars; i++ )
        {
            Vec_IntPush( vLits, Abc_Var2Lit(i, sat_solver_var_value(pSat, i)) );
            printf( "%d", sat_solver_var_value(pSat, i) );
        }
        printf( "\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + nVars );
        if ( status == 0 )
            break;
    }

    sat_solver_delete( pSat );
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
}